

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_12.cpp
# Opt level: O2

int main(void)

{
  string to;
  string from;
  FileType local_54;
  string local_50;
  string local_30;
  
  local_50._M_dataplus._M_p._0_4_ = 0;
  prompt_filename_abi_cxx11_(&local_30,(FileType *)&local_50);
  local_54 = out;
  prompt_filename_abi_cxx11_(&local_50,&local_54);
  reverse_chars(&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return 0;
}

Assistant:

int main()
{
	try
	{
		auto from = prompt_filename(FileType::in);
		auto to = prompt_filename(FileType::out);
		reverse_chars(from, to);
	}
	catch (const std::exception& e)
	{
		std::cerr << e.what() << std::endl;
	}
}